

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void brk_00(void)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  brk_f = '\x01';
  pc = pc + 1;
  uVar3 = (uint)sp;
  sp = sp + 0xff;
  RAM[(int)(uVar3 + 0x100)] = (ubyte)((ulong)pc / 0x100);
  uVar3 = (uint)sp;
  sp = sp + 0xff;
  RAM[(int)(uVar3 + 0x100)] = (ubyte)((ulong)pc % 0x100);
  update_dyn_p();
  uVar3 = (uint)sp;
  sp = sp + 0xff;
  RAM[(int)(uVar3 + 0x100)] = dyn_p;
  intd_f = '\x01';
  bVar1 = getbyte(0xfffe);
  bVar2 = getbyte(0xffff);
  pc = (ushort)bVar1 + (ushort)bVar2 * 0x100;
  return;
}

Assistant:

void brk_00(void) {
    brk_f = 1;
    pc++;
    pushbyte(pc / 0x100);
    pushbyte(pc % 0x100);
    update_dyn_p();
    pushbyte(dyn_p);
    intd_f = 1;
    pc = getbyte(0xFFFE) + (0x100 * getbyte(0xFFFF));
}